

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

void __thiscall
Am_Point_List_Data::Add(Am_Point_List_Data *this,float x,float y,Am_Add_Position position)

{
  undefined1 *puVar1;
  Am_Point_List_Data *pAVar2;
  Am_Point_Item *pAVar3;
  Am_Point_Item *pAVar4;
  Am_Point_Item **ppAVar5;
  Am_Point_Item **ppAVar6;
  
  puVar1 = &(this->super_Am_Wrapper).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  pAVar4 = (Am_Point_Item *)operator_new(0x18);
  pAVar4->x = x;
  pAVar4->y = y;
  pAVar4->prev = (Am_Point_Item *)0x0;
  pAVar4->next = (Am_Point_Item *)0x0;
  if (position == Am_HEAD) {
    ppAVar5 = &this->head;
    pAVar3 = this->head;
    ppAVar6 = &pAVar3->prev;
    if (pAVar3 == (Am_Point_Item *)0x0) {
      ppAVar6 = &this->tail;
    }
    *ppAVar6 = pAVar4;
    pAVar4->prev = (Am_Point_Item *)0x0;
    pAVar4->next = pAVar3;
  }
  else {
    ppAVar5 = &this->tail;
    pAVar2 = (Am_Point_List_Data *)this->tail;
    if (pAVar2 != (Am_Point_List_Data *)0x0) {
      this = pAVar2;
    }
    this->head = pAVar4;
    pAVar4->next = (Am_Point_Item *)0x0;
    pAVar4->prev = (Am_Point_Item *)pAVar2;
  }
  *ppAVar5 = pAVar4;
  return;
}

Assistant:

void
Am_Point_List_Data::Add(float x, float y, Am_Add_Position position)
{
  ++number;
  Am_Point_Item *item = new Am_Point_Item(x, y);
  if (position == Am_HEAD) {
    if (head)
      head->prev = item;
    else
      tail = item;
    item->prev = nullptr;
    item->next = head;
    head = item;
  } else {
    if (tail)
      tail->next = item;
    else
      head = item;
    item->next = nullptr;
    item->prev = tail;
    tail = item;
  }
}